

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_tools.cpp
# Opt level: O0

string * getArticle(string *word)

{
  initializer_list<char> __l;
  bool bVar1;
  int iVar2;
  char *__val;
  ulong in_RSI;
  allocator local_62;
  allocator local_61;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_58;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_50;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> iter;
  allocator_type local_2e;
  char local_2d [5];
  iterator local_28;
  size_type local_20;
  string *word_local;
  
  word_local = word;
  if (getArticle(std::__cxx11::string)::vowels == '\0') {
    iVar2 = __cxa_guard_acquire(&getArticle(std::__cxx11::string)::vowels);
    if (iVar2 != 0) {
      builtin_strncpy(local_2d,"aeiou",5);
      local_28 = local_2d;
      local_20 = 5;
      std::allocator<char>::allocator();
      __l._M_len = local_20;
      __l._M_array = local_28;
      std::vector<char,_std::allocator<char>_>::vector(&getArticle::vowels,__l,&local_2e);
      std::allocator<char>::~allocator(&local_2e);
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&getArticle::vowels,
                   &__dso_handle);
      __cxa_guard_release(&getArticle(std::__cxx11::string)::vowels);
    }
  }
  local_50._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(&getArticle::vowels)
  ;
  local_58._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&getArticle::vowels);
  __val = (char *)std::__cxx11::string::operator[](in_RSI);
  local_48 = std::
             find<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char>
                       (local_50,local_58,__val);
  local_60._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&getArticle::vowels);
  bVar1 = __gnu_cxx::operator==(&local_48,&local_60);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)word,"a",&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)word,"an",&local_62);
    std::allocator<char>::~allocator((allocator<char> *)&local_62);
  }
  return word;
}

Assistant:

std::string getArticle(std::string word) {
  static const std::vector<char> vowels = { 'a', 'e', 'i', 'o', 'u' };
  auto iter = std::find(vowels.begin(), vowels.end(), word[0]);
  if(iter == vowels.end()) { return "a"; }
  return "an";
}